

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O0

int run_tests(int64_t *sizes,int sizes_cnt,int type)

{
  EVP_PKEY_CTX *ctx;
  uchar *puVar1;
  code *tbs;
  int in_EDX;
  size_t siglen;
  size_t siglen_00;
  size_t siglen_01;
  size_t siglen_02;
  size_t siglen_03;
  size_t siglen_04;
  size_t siglen_05;
  size_t siglen_06;
  size_t siglen_07;
  size_t siglen_08;
  size_t siglen_09;
  size_t siglen_10;
  size_t siglen_11;
  size_t siglen_12;
  int in_ESI;
  utimbuf *puVar2;
  char *pcVar3;
  utimbuf *puVar4;
  long in_RDI;
  EVP_PKEY_CTX *pEVar5;
  size_t in_R8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  double extraout_XMM0_Qa_13;
  double extraout_XMM0_Qa_14;
  double extraout_XMM0_Qa_15;
  double extraout_XMM0_Qa_16;
  double extraout_XMM0_Qa_17;
  double extraout_XMM0_Qa_18;
  double extraout_XMM0_Qa_19;
  double extraout_XMM0_Qa_20;
  double extraout_XMM0_Qa_21;
  double extraout_XMM0_Qa_22;
  double extraout_XMM0_Qa_23;
  double extraout_XMM0_Qa_24;
  double extraout_XMM0_Qa_25;
  double extraout_XMM0_Qa_26;
  int64_t size_13;
  int64_t size_12;
  int64_t size_11;
  int64_t size_10;
  int64_t size_9;
  int64_t size_8;
  int64_t size_7;
  int64_t size_6;
  int64_t size_5;
  int64_t size_4;
  int64_t size_3;
  int64_t size_2;
  int64_t size_1;
  int64_t size;
  int64_t *dst;
  double diff;
  double usec2;
  double usec1;
  int res;
  int test;
  size_t in_stack_00000798;
  int64_t *in_stack_000007a0;
  size_t in_stack_000047b8;
  int64_t *in_stack_000047c0;
  size_t in_stack_ffffffffffffff48;
  int64_t *in_stack_ffffffffffffff50;
  utimbuf *in_stack_ffffffffffffff58;
  utimbuf *in_stack_ffffffffffffff60;
  utimbuf *in_stack_ffffffffffffff68;
  utimbuf *in_stack_ffffffffffffff70;
  utimbuf *in_stack_ffffffffffffff88;
  utimbuf *in_stack_ffffffffffffff90;
  double local_38;
  int local_20;
  int local_1c;
  
  ctx = (EVP_PKEY_CTX *)malloc(0x52080);
  printf("-------\nRunning tests with %s:\n",test_names[in_EDX]);
  local_20 = 0;
  local_38 = 0.0;
  printf("%-29s","extra.h yysort1_int64");
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    puVar1 = (uchar *)(long)local_1c;
    puVar4 = *(utimbuf **)(in_RDI + (long)puVar1 * 8);
    puVar2 = (utimbuf *)((ulong)puVar4 & 0xffffffff);
    pEVar5 = ctx;
    fill(&in_stack_ffffffffffffff60->actime,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
         (int)in_stack_ffffffffffffff58);
    utime((char *)pEVar5,puVar2);
    puVar2 = puVar4;
    pEVar5 = ctx;
    yysort1_int64(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    utime((char *)pEVar5,puVar2);
    local_20 = verify(ctx,(uchar *)((ulong)puVar4 & 0xffffffff),siglen,puVar1,in_R8);
    if (local_20 == 0) break;
    local_38 = (extraout_XMM0_Qa_00 - extraout_XMM0_Qa) + local_38;
  }
  pcVar3 = "FAILED";
  if (local_20 != 0) {
    pcVar3 = "ok";
  }
  printf(" - %s, %10.1f usec\n",local_38,pcVar3);
  fflush((FILE *)0x0);
  if (local_20 != 0) {
    local_20 = 0;
    local_38 = 0.0;
    printf("%-29s","extra.h yysort2_int64");
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
      puVar1 = (uchar *)(long)local_1c;
      puVar4 = *(utimbuf **)(in_RDI + (long)puVar1 * 8);
      puVar2 = (utimbuf *)((ulong)puVar4 & 0xffffffff);
      pEVar5 = ctx;
      fill(&in_stack_ffffffffffffff60->actime,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
           (int)in_stack_ffffffffffffff58);
      utime((char *)pEVar5,puVar2);
      puVar2 = puVar4;
      pEVar5 = ctx;
      yysort2_int64(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      utime((char *)pEVar5,puVar2);
      local_20 = verify(ctx,(uchar *)((ulong)puVar4 & 0xffffffff),siglen_00,puVar1,in_R8);
      if (local_20 == 0) break;
      local_38 = (extraout_XMM0_Qa_02 - extraout_XMM0_Qa_01) + local_38;
    }
    pcVar3 = "FAILED";
    if (local_20 != 0) {
      pcVar3 = "ok";
    }
    printf(" - %s, %10.1f usec\n",local_38,pcVar3);
    fflush((FILE *)0x0);
    if (local_20 != 0) {
      local_20 = 0;
      local_38 = 0.0;
      printf("%-29s","extra.h radix_sort7_int64");
      for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
        puVar1 = (uchar *)(long)local_1c;
        puVar4 = *(utimbuf **)(in_RDI + (long)puVar1 * 8);
        puVar2 = (utimbuf *)((ulong)puVar4 & 0xffffffff);
        pEVar5 = ctx;
        fill(&in_stack_ffffffffffffff60->actime,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             (int)in_stack_ffffffffffffff58);
        utime((char *)pEVar5,puVar2);
        puVar2 = puVar4;
        pEVar5 = ctx;
        radix_sort7_int64(in_stack_000047c0,in_stack_000047b8);
        utime((char *)pEVar5,puVar2);
        local_20 = verify(ctx,(uchar *)((ulong)puVar4 & 0xffffffff),siglen_01,puVar1,in_R8);
        if (local_20 == 0) break;
        local_38 = (extraout_XMM0_Qa_04 - extraout_XMM0_Qa_03) + local_38;
      }
      pcVar3 = "FAILED";
      if (local_20 != 0) {
        pcVar3 = "ok";
      }
      printf(" - %s, %10.1f usec\n",local_38,pcVar3);
      fflush((FILE *)0x0);
      if (local_20 != 0) {
        local_20 = 0;
        local_38 = 0.0;
        printf("%-29s","sort.h tim_sort");
        for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
          puVar1 = (uchar *)(long)local_1c;
          puVar4 = *(utimbuf **)(in_RDI + (long)puVar1 * 8);
          puVar2 = (utimbuf *)((ulong)puVar4 & 0xffffffff);
          pEVar5 = ctx;
          fill(&in_stack_ffffffffffffff60->actime,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               (int)in_stack_ffffffffffffff58);
          utime((char *)pEVar5,puVar2);
          puVar2 = puVar4;
          pEVar5 = ctx;
          sorter_tim_sort(in_stack_000007a0,in_stack_00000798);
          utime((char *)pEVar5,puVar2);
          local_20 = verify(ctx,(uchar *)((ulong)puVar4 & 0xffffffff),siglen_02,puVar1,in_R8);
          if (local_20 == 0) break;
          local_38 = (extraout_XMM0_Qa_06 - extraout_XMM0_Qa_05) + local_38;
        }
        pcVar3 = "FAILED";
        if (local_20 != 0) {
          pcVar3 = "ok";
        }
        printf(" - %s, %10.1f usec\n",local_38,pcVar3);
        fflush((FILE *)0x0);
        if (local_20 != 0) {
          local_20 = 0;
          local_38 = 0.0;
          printf("%-29s","sort.h quick_sort");
          for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
            puVar1 = (uchar *)(long)local_1c;
            puVar4 = *(utimbuf **)(in_RDI + (long)puVar1 * 8);
            puVar2 = (utimbuf *)((ulong)puVar4 & 0xffffffff);
            pEVar5 = ctx;
            fill(&in_stack_ffffffffffffff60->actime,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                 (int)in_stack_ffffffffffffff58);
            utime((char *)pEVar5,puVar2);
            puVar2 = puVar4;
            pEVar5 = ctx;
            sorter_quick_sort(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
            utime((char *)pEVar5,puVar2);
            local_20 = verify(ctx,(uchar *)((ulong)puVar4 & 0xffffffff),siglen_03,puVar1,in_R8);
            if (local_20 == 0) break;
            local_38 = (extraout_XMM0_Qa_08 - extraout_XMM0_Qa_07) + local_38;
          }
          pcVar3 = "FAILED";
          if (local_20 != 0) {
            pcVar3 = "ok";
          }
          printf(" - %s, %10.1f usec\n",local_38,pcVar3);
          fflush((FILE *)0x0);
          if (local_20 != 0) {
            local_20 = 0;
            local_38 = 0.0;
            printf("%-29s","extra.h std_sort_int64");
            for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
              puVar1 = (uchar *)(long)local_1c;
              puVar4 = *(utimbuf **)(in_RDI + (long)puVar1 * 8);
              puVar2 = (utimbuf *)((ulong)puVar4 & 0xffffffff);
              pEVar5 = ctx;
              fill(&in_stack_ffffffffffffff60->actime,
                   (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),(int)in_stack_ffffffffffffff58);
              utime((char *)pEVar5,puVar2);
              pEVar5 = ctx;
              in_stack_ffffffffffffff90 = puVar4;
              std_sort_int64(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
              utime((char *)pEVar5,puVar4);
              local_20 = verify(ctx,(uchar *)((ulong)in_stack_ffffffffffffff90 & 0xffffffff),
                                siglen_04,puVar1,in_R8);
              if (local_20 == 0) break;
              local_38 = (extraout_XMM0_Qa_10 - extraout_XMM0_Qa_09) + local_38;
            }
            pcVar3 = "FAILED";
            if (local_20 != 0) {
              pcVar3 = "ok";
            }
            printf(" - %s, %10.1f usec\n",local_38,pcVar3);
            fflush((FILE *)0x0);
            if (local_20 != 0) {
              local_20 = 0;
              local_38 = 0.0;
              printf("%-29s","extra.h std_stable_int64");
              for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
                puVar1 = (uchar *)(long)local_1c;
                puVar4 = *(utimbuf **)(in_RDI + (long)puVar1 * 8);
                puVar2 = (utimbuf *)((ulong)puVar4 & 0xffffffff);
                pEVar5 = ctx;
                fill(&in_stack_ffffffffffffff60->actime,
                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),(int)in_stack_ffffffffffffff58)
                ;
                utime((char *)pEVar5,puVar2);
                pEVar5 = ctx;
                in_stack_ffffffffffffff88 = puVar4;
                std_stable_int64(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
                utime((char *)pEVar5,puVar4);
                local_20 = verify(ctx,(uchar *)((ulong)in_stack_ffffffffffffff88 & 0xffffffff),
                                  siglen_05,puVar1,in_R8);
                if (local_20 == 0) break;
                local_38 = (extraout_XMM0_Qa_12 - extraout_XMM0_Qa_11) + local_38;
              }
              pcVar3 = "FAILED";
              if (local_20 != 0) {
                pcVar3 = "ok";
              }
              printf(" - %s, %10.1f usec\n",local_38,pcVar3);
              fflush((FILE *)0x0);
              if (local_20 != 0) {
                local_20 = 0;
                local_38 = 0.0;
                printf("%-29s","sort.h heap_sort");
                for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
                  puVar1 = (uchar *)(long)local_1c;
                  puVar4 = *(utimbuf **)(in_RDI + (long)puVar1 * 8);
                  puVar2 = (utimbuf *)((ulong)puVar4 & 0xffffffff);
                  pEVar5 = ctx;
                  fill(&in_stack_ffffffffffffff60->actime,
                       (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                       (int)in_stack_ffffffffffffff58);
                  utime((char *)pEVar5,puVar2);
                  puVar2 = puVar4;
                  pEVar5 = ctx;
                  sorter_heap_sort(&in_stack_ffffffffffffff60->actime,
                                   (size_t)in_stack_ffffffffffffff58);
                  utime((char *)pEVar5,puVar2);
                  local_20 = verify(ctx,(uchar *)((ulong)puVar4 & 0xffffffff),siglen_06,puVar1,in_R8
                                   );
                  if (local_20 == 0) break;
                  local_38 = (extraout_XMM0_Qa_14 - extraout_XMM0_Qa_13) + local_38;
                }
                pcVar3 = "FAILED";
                if (local_20 != 0) {
                  pcVar3 = "ok";
                }
                printf(" - %s, %10.1f usec\n",local_38,pcVar3);
                fflush((FILE *)0x0);
                if (local_20 != 0) {
                  local_20 = 0;
                  local_38 = 0.0;
                  printf("%-29s","sort.h merge_sort");
                  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
                    puVar1 = (uchar *)(long)local_1c;
                    puVar4 = *(utimbuf **)(in_RDI + (long)puVar1 * 8);
                    puVar2 = (utimbuf *)((ulong)puVar4 & 0xffffffff);
                    pEVar5 = ctx;
                    fill(&in_stack_ffffffffffffff60->actime,
                         (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (int)in_stack_ffffffffffffff58);
                    utime((char *)pEVar5,puVar2);
                    puVar2 = puVar4;
                    pEVar5 = ctx;
                    sorter_merge_sort(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
                    utime((char *)pEVar5,puVar2);
                    local_20 = verify(ctx,(uchar *)((ulong)puVar4 & 0xffffffff),siglen_07,puVar1,
                                      in_R8);
                    if (local_20 == 0) break;
                    local_38 = (extraout_XMM0_Qa_16 - extraout_XMM0_Qa_15) + local_38;
                  }
                  pcVar3 = "FAILED";
                  if (local_20 != 0) {
                    pcVar3 = "ok";
                  }
                  printf(" - %s, %10.1f usec\n",local_38,pcVar3);
                  fflush((FILE *)0x0);
                  if (local_20 != 0) {
                    local_20 = 0;
                    local_38 = 0.0;
                    printf("%-29s","sort.h shell_sort");
                    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
                      puVar1 = (uchar *)(long)local_1c;
                      puVar4 = *(utimbuf **)(in_RDI + (long)puVar1 * 8);
                      puVar2 = (utimbuf *)((ulong)puVar4 & 0xffffffff);
                      pEVar5 = ctx;
                      fill(&in_stack_ffffffffffffff60->actime,
                           (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                           (int)in_stack_ffffffffffffff58);
                      utime((char *)pEVar5,puVar2);
                      pEVar5 = ctx;
                      in_stack_ffffffffffffff70 = puVar4;
                      sorter_shell_sort((int64_t *)ctx,(size_t)puVar4);
                      utime((char *)pEVar5,puVar4);
                      local_20 = verify(ctx,(uchar *)((ulong)in_stack_ffffffffffffff70 & 0xffffffff)
                                        ,siglen_08,puVar1,in_R8);
                      if (local_20 == 0) break;
                      local_38 = (extraout_XMM0_Qa_18 - extraout_XMM0_Qa_17) + local_38;
                    }
                    pcVar3 = "FAILED";
                    if (local_20 != 0) {
                      pcVar3 = "ok";
                    }
                    printf(" - %s, %10.1f usec\n",local_38,pcVar3);
                    fflush((FILE *)0x0);
                    if (local_20 != 0) {
                      local_20 = 0;
                      local_38 = 0.0;
                      printf("%-29s","sort.h merge_sort_in_place");
                      for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
                        puVar1 = (uchar *)(long)local_1c;
                        puVar4 = *(utimbuf **)(in_RDI + (long)puVar1 * 8);
                        puVar2 = (utimbuf *)((ulong)puVar4 & 0xffffffff);
                        pEVar5 = ctx;
                        fill(&in_stack_ffffffffffffff60->actime,
                             (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                             (int)in_stack_ffffffffffffff58);
                        utime((char *)pEVar5,puVar2);
                        pEVar5 = ctx;
                        in_stack_ffffffffffffff68 = puVar4;
                        sorter_merge_sort_in_place
                                  (&in_stack_ffffffffffffff90->actime,
                                   (size_t)in_stack_ffffffffffffff88);
                        utime((char *)pEVar5,puVar4);
                        local_20 = verify(ctx,(uchar *)((ulong)in_stack_ffffffffffffff68 &
                                                       0xffffffff),siglen_09,puVar1,in_R8);
                        if (local_20 == 0) break;
                        local_38 = (extraout_XMM0_Qa_20 - extraout_XMM0_Qa_19) + local_38;
                      }
                      pcVar3 = "FAILED";
                      if (local_20 != 0) {
                        pcVar3 = "ok";
                      }
                      printf(" - %s, %10.1f usec\n",local_38,pcVar3);
                      fflush((FILE *)0x0);
                      if (local_20 != 0) {
                        local_20 = 0;
                        local_38 = 0.0;
                        printf("%-29s","sort.h grail_sort");
                        for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
                          puVar1 = (uchar *)(long)local_1c;
                          puVar4 = *(utimbuf **)(in_RDI + (long)puVar1 * 8);
                          puVar2 = (utimbuf *)((ulong)puVar4 & 0xffffffff);
                          pEVar5 = ctx;
                          fill(&puVar4->actime,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                               (int)in_stack_ffffffffffffff58);
                          utime((char *)pEVar5,puVar2);
                          pEVar5 = ctx;
                          in_stack_ffffffffffffff60 = puVar4;
                          sorter_grail_sort(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
                          utime((char *)pEVar5,puVar4);
                          local_20 = verify(ctx,(uchar *)((ulong)in_stack_ffffffffffffff60 &
                                                         0xffffffff),siglen_10,puVar1,in_R8);
                          if (local_20 == 0) break;
                          local_38 = (extraout_XMM0_Qa_22 - extraout_XMM0_Qa_21) + local_38;
                        }
                        pcVar3 = "FAILED";
                        if (local_20 != 0) {
                          pcVar3 = "ok";
                        }
                        printf(" - %s, %10.1f usec\n",local_38,pcVar3);
                        fflush((FILE *)0x0);
                        if (local_20 != 0) {
                          local_20 = 0;
                          local_38 = 0.0;
                          printf("%-29s","sort.h sqrt_sort");
                          for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
                            puVar1 = (uchar *)(long)local_1c;
                            puVar4 = *(utimbuf **)(in_RDI + (long)puVar1 * 8);
                            puVar2 = (utimbuf *)((ulong)puVar4 & 0xffffffff);
                            pEVar5 = ctx;
                            fill(&in_stack_ffffffffffffff60->actime,(int)((ulong)puVar4 >> 0x20),
                                 (int)puVar4);
                            utime((char *)pEVar5,puVar2);
                            pEVar5 = ctx;
                            in_stack_ffffffffffffff58 = puVar4;
                            sorter_sqrt_sort(&in_stack_ffffffffffffff70->actime,
                                             (size_t)in_stack_ffffffffffffff68);
                            utime((char *)pEVar5,puVar4);
                            local_20 = verify(ctx,(uchar *)((ulong)in_stack_ffffffffffffff58 &
                                                           0xffffffff),siglen_11,puVar1,in_R8);
                            if (local_20 == 0) break;
                            local_38 = (extraout_XMM0_Qa_24 - extraout_XMM0_Qa_23) + local_38;
                          }
                          pcVar3 = "FAILED";
                          if (local_20 != 0) {
                            pcVar3 = "ok";
                          }
                          printf(" - %s, %10.1f usec\n",local_38,pcVar3);
                          fflush((FILE *)0x0);
                          if (local_20 != 0) {
                            local_20 = 0;
                            local_38 = 0.0;
                            printf("%-29s","stdlib qsort");
                            for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
                              puVar4 = *(utimbuf **)(in_RDI + (long)local_1c * 8);
                              puVar2 = (utimbuf *)((ulong)puVar4 & 0xffffffff);
                              pEVar5 = ctx;
                              fill(&in_stack_ffffffffffffff60->actime,
                                   (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                   (int)in_stack_ffffffffffffff58);
                              utime((char *)pEVar5,puVar2);
                              tbs = simple_cmp;
                              pEVar5 = ctx;
                              puVar2 = puVar4;
                              qsort(ctx,(size_t)puVar4,8,simple_cmp);
                              utime((char *)pEVar5,puVar4);
                              local_20 = verify(ctx,(uchar *)((ulong)puVar2 & 0xffffffff),siglen_12,
                                                (uchar *)tbs,in_R8);
                              if (local_20 == 0) break;
                              local_38 = (extraout_XMM0_Qa_26 - extraout_XMM0_Qa_25) + local_38;
                            }
                            pcVar3 = "FAILED";
                            if (local_20 != 0) {
                              pcVar3 = "ok";
                            }
                            printf(" - %s, %10.1f usec\n",local_38,pcVar3);
                            fflush((FILE *)0x0);
                            if (local_20 != 0) {
                              free(ctx);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int run_tests(int64_t *sizes, int sizes_cnt, int type) {
  int test, res;
  double usec1, usec2, diff;
  int64_t *dst = (int64_t *)malloc(MAXSIZE * sizeof(int64_t));
  printf("-------\nRunning tests with %s:\n", test_names[type]);
  TEST_EXTRA_H(yysort1_int64);
  TEST_EXTRA_H(yysort2_int64);
  // TEST_EXTRA_H(yysort1_int64_sb);
  // TEST_EXTRA_H(yysort2_int64_sb);
  // TEST_EXTRA_H(sort_rela589n_int64);
  TEST_EXTRA_H(radix_sort7_int64);

  TEST_SORT_H(tim_sort);
  TEST_SORT_H(quick_sort);
  TEST_EXTRA_H(std_sort_int64);
  TEST_EXTRA_H(std_stable_int64);
  TEST_SORT_H(heap_sort);
  TEST_SORT_H(merge_sort);
  TEST_SORT_H(shell_sort);
  TEST_SORT_H(merge_sort_in_place);
  TEST_SORT_H(grail_sort);
  TEST_SORT_H(sqrt_sort);
  // TEST_SORT_H(rec_stable_sort);
  // TEST_SORT_H(grail_sort_dyn_buffer);

  TEST_STDLIB(qsort);
#if !defined(__linux__) && !defined(__CYGWIN__)
  TEST_STDLIB(heapsort);
  TEST_STDLIB(mergesort);
#endif

  if (MAXSIZE < 10000) {
    TEST_SORT_H(selection_sort);
    TEST_SORT_H(bubble_sort);
    TEST_SORT_H(binary_insertion_sort);
    TEST_SORT_H(bitonic_sort);
  }
  free(dst);
  return 0;
}